

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstring_view.cpp
# Opt level: O0

void __thiscall
SStringViewInit_Empty_Test<(anonymous_namespace)::string_maker<std::shared_ptr<char>_>_>::TestBody
          (SStringViewInit_Empty_Test<(anonymous_namespace)::string_maker<std::shared_ptr<char>_>_>
           *this)

{
  bool bVar1;
  size_t length;
  char *pcVar2;
  const_iterator __first;
  const_iterator __last;
  char *in_R9;
  AssertHelper local_178;
  Message local_170;
  int local_164;
  difference_type local_160;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_128;
  Message local_120;
  bool local_111;
  undefined1 local_110 [8];
  AssertionResult gtest_ar_;
  Message local_f8;
  unsigned_long local_f0;
  size_type local_e8;
  undefined1 local_e0 [8];
  AssertionResult gtest_ar_2;
  Message local_c8;
  uint local_bc;
  size_type local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar_1;
  Message local_98;
  uint local_8c;
  size_type local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar;
  sstring_view<std::shared_ptr<char>_> sv;
  undefined1 local_48 [8];
  shared_ptr<char> ptr;
  string src;
  TypeParam t;
  SStringViewInit_Empty_Test<(anonymous_namespace)::string_maker<std::shared_ptr<char>_>_>
  *this_local;
  
  std::__cxx11::string::string
            ((string *)&ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  anon_unknown.dwarf_e1429::string_maker<std::shared_ptr<char>_>::operator()
            ((string_maker<std::shared_ptr<char>_> *)local_48,(string *)((long)&src.field_2 + 0xf));
  length = std::__cxx11::string::length();
  anon_unknown.dwarf_e1429::make_sstring_view<char>
            ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_,(shared_ptr<char> *)local_48
             ,length);
  local_88 = pstore::sstring_view<std::shared_ptr<char>_>::size
                       ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  local_8c = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_80,"sv.size ()","0U",&local_88,&local_8c);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_98);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_80);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x65,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  local_b8 = pstore::sstring_view<std::shared_ptr<char>_>::length
                       ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  local_bc = 0;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_b0,"sv.length ()","0U",&local_b8,&local_bc);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x66,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_e8 = pstore::sstring_view<std::shared_ptr<char>_>::max_size
                       ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  local_f0 = std::numeric_limits<unsigned_long>::max();
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_e0,"sv.max_size ()","std::numeric_limits<std::size_t>::max ()",
             &local_e8,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x67,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e0);
  local_111 = pstore::sstring_view<std::shared_ptr<char>_>::empty
                        ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_110,&local_111,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_110);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_3.message_,(internal *)local_110,(AssertionResult *)"sv.empty ()"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x68,pcVar2);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_110);
  __first = std::begin<pstore::sstring_view<std::shared_ptr<char>>>
                      ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  __last = std::end<pstore::sstring_view<std::shared_ptr<char>>>
                     ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  local_160 = std::distance<char_const*>(__first,__last);
  local_164 = 0;
  testing::internal::EqHelper::Compare<long,_int,_nullptr>
            ((EqHelper *)local_158,"std::distance (std::begin (sv), std::end (sv))","0",&local_160,
             &local_164);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_170);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_158);
    testing::internal::AssertHelper::AssertHelper
              (&local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/adt/test_sstring_view.cpp"
               ,0x69,pcVar2);
    testing::internal::AssertHelper::operator=(&local_178,&local_170);
    testing::internal::AssertHelper::~AssertHelper(&local_178);
    testing::Message::~Message(&local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  pstore::sstring_view<std::shared_ptr<char>_>::~sstring_view
            ((sstring_view<std::shared_ptr<char>_> *)&gtest_ar.message_);
  std::shared_ptr<char>::~shared_ptr((shared_ptr<char> *)local_48);
  std::__cxx11::string::~string
            ((string *)&ptr.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TYPED_TEST (SStringViewInit, Empty) {
    using namespace pstore;
    TypeParam t;
    std::string const src;
    auto ptr = t (src);
    auto sv = make_sstring_view (std::move (ptr), src.length ());
    EXPECT_EQ (sv.size (), 0U);
    EXPECT_EQ (sv.length (), 0U);
    EXPECT_EQ (sv.max_size (), std::numeric_limits<std::size_t>::max ());
    EXPECT_TRUE (sv.empty ());
    EXPECT_EQ (std::distance (std::begin (sv), std::end (sv)), 0);
}